

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

Client * __thiscall
kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++:205:17)>
::operator()(Client *__return_storage_ptr__,
            Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_membrane_test_c__:205:17)>
            *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long *plVar3;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  undefined1 local_90 [56];
  char *pcStack_58;
  undefined8 local_50;
  undefined8 *local_38;
  long *local_30;
  Maybe<capnp::MessageSize> local_28;
  
  local_28.ptr.isSet = false;
  capnproto_test::capnp::test::TestMembrane::Client::makeThingRequest
            ((Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
              *)(local_90 + 0x30),&((this->f).env)->membraned,&local_28);
  capnp::
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  ::send((Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
          *)local_90,(int)local_90 + 0x30,__buf,in_RCX,in_R8D);
  capnproto_test::capnp::test::TestMembrane::MakeThingResults::Pipeline::getThing
            (__return_storage_ptr__,(Pipeline *)(local_90 + 8));
  uVar2 = local_90._32_8_;
  uVar1 = local_90._24_8_;
  if ((WirePointer *)local_90._24_8_ != (WirePointer *)0x0) {
    local_90._24_8_ = (WirePointer *)0x0;
    local_90._32_4_ = 0;
    local_90._36_2_ = 0;
    local_90._38_2_ = 0;
    (***(_func_int ***)local_90._40_8_)(local_90._40_8_,uVar1,8,uVar2,uVar2,0);
  }
  uVar1 = local_90._16_8_;
  if ((long *)local_90._16_8_ != (long *)0x0) {
    local_90._16_8_ = (long *)0x0;
    (**((CapTableReader *)local_90._8_8_)->_vptr_CapTableReader)
              (local_90._8_8_,*(long *)(*(long *)uVar1 + -0x10) + uVar1);
  }
  uVar1 = local_90._0_8_;
  if ((SegmentBuilder *)local_90._0_8_ != (SegmentBuilder *)0x0) {
    local_90._0_8_ = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  plVar3 = local_30;
  if (local_30 != (long *)0x0) {
    local_30 = (long *)0x0;
    (**(code **)*local_38)(local_38,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  capnp::Capability::Client::whenResolved((Client *)local_90);
  local_90._48_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++"
  ;
  pcStack_58 = "operator()";
  local_50 = 0x5000000cf;
  Promise<void>::wait((Promise<void> *)local_90,&((this->f).env)->waitScope);
  uVar1 = local_90._0_8_;
  if ((OwnPromiseNode)local_90._0_8_ != (OwnPromiseNode)0x0) {
    local_90._0_8_ = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }